

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O3

int * __thiscall amrex::BaseFab<int>::dataPtr(BaseFab<int> *this,int n)

{
  if (this->dptr != (int *)0x0) {
    return this->dptr +
           (long)(((this->domain).bigend.vect[2] - (this->domain).smallend.vect[2]) + 1) *
           (long)(((this->domain).bigend.vect[1] - (this->domain).smallend.vect[1]) + 1) *
           (long)(((this->domain).bigend.vect[0] - (this->domain).smallend.vect[0]) + 1) * (long)n;
  }
  return (int *)0x0;
}

Assistant:

T* dataPtr (int n = 0) noexcept {
        if (this->dptr) {
            return &(this->dptr[n*this->domain.numPts()]);
        } else {
            return nullptr;
        }
    }